

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool __thiscall QString::startsWith(QString *this,QString *s,CaseSensitivity cs)

{
  QStringView haystack;
  QStringView needle;
  bool bVar1;
  QString *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000000 [12];
  CaseSensitivity in_stack_ffffffffffffffd8;
  storage_type_conflict *in_stack_fffffffffffffff0;
  qsizetype qVar2;
  
  qVar2 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_RDI,in_RSI);
  QStringView::QStringView<QString,_true>(in_RDI,in_RSI);
  haystack.m_size._4_4_ = cs;
  haystack._0_12_ = in_stack_00000000;
  needle.m_size = qVar2;
  needle.m_data = in_stack_fffffffffffffff0;
  bVar1 = (anonymous_namespace)::qt_starts_with_impl<QStringView,QStringView>
                    (haystack,needle,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QString::startsWith(const QString& s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), QStringView(s), cs);
}